

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O3

Node * __thiscall
cali::internal::MetadataTree::get_path
          (MetadataTree *this,Attribute *attr,size_t n,Variant *data,Node *parent)

{
  bool bVar1;
  Node *pNVar2;
  size_t sVar3;
  cali_id_t attr_00;
  
  if (parent == (Node *)0x0) {
    parent = (Node *)((long)mG._M_b._M_p + 0x10);
  }
  if (n != 0) {
    sVar3 = 0;
    pNVar2 = parent;
    do {
      parent = *(Node **)((long)&((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->m_id +
                         (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
      if (parent == (Node *)0x0) {
LAB_001f584f:
        pNVar2 = create_path(this,attr,n - sVar3,data + sVar3,pNVar2);
        return pNVar2;
      }
      while( true ) {
        if (attr->m_node == (Node *)0x0) {
          attr_00 = 0xffffffffffffffff;
        }
        else {
          attr_00 = attr->m_node->m_id;
        }
        bVar1 = Node::equals(parent,attr_00,data + sVar3);
        if (bVar1) break;
        parent = *(Node **)((long)&(((parent->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                   super_LockfreeIntrusiveTree<cali::Node>).m_node +
                           (parent->super_LockfreeIntrusiveTree<cali::Node>).m_node);
        if (parent == (Node *)0x0) goto LAB_001f584f;
      }
      sVar3 = sVar3 + 1;
      pNVar2 = parent;
    } while (sVar3 != n);
  }
  return parent;
}

Assistant:

Node* MetadataTree::get_path(const Attribute& attr, size_t n, const Variant* data, Node* parent = nullptr)
{
    Node*  node = parent ? parent : &(mG.load()->root);
    size_t base = 0;

    for (size_t i = 0; i < n; ++i) {
        parent = node;

        for (node = parent->first_child(); node && !node->equals(attr.id(), data[i]); node = node->next_sibling())
            ;

        if (!node)
            break;

        ++base;
    }

    if (!node)
        node = create_path(attr, n - base, data + base, parent);

    return node;
}